

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int op_http_stream_seek(void *_stream,opus_int64 _offset,int _whence)

{
  OpusHTTPConn **_pnext;
  long *plVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  OpusHTTPConn *pOVar8;
  OpusHTTPConn *_conn;
  OpusHTTPConn **ppOVar9;
  OpusHTTPConn **ppOVar10;
  OpusHTTPConn **_pnext_00;
  op_time seek_time;
  int local_54;
  op_time local_48;
  OpusHTTPConn *local_38;
  
  if (*(int *)((long)_stream + 0x280) == 0) {
    return -1;
  }
  lVar6 = *(long *)((long)_stream + 0x260);
  lVar4 = (long)*(int *)((long)_stream + 0x27c);
  lVar5 = lVar6;
  if (-1 < lVar4) {
    lVar5 = *(long *)((long)_stream + lVar4 * 0x60);
  }
  if (_whence == 2) {
    if (0x7fffffffffffffff - lVar6 < _offset || -_offset != lVar6 && _offset <= -lVar6) {
      return -1;
    }
    _offset = _offset + lVar6;
  }
  else if (_whence == 1) {
    if (0x7fffffffffffffff - lVar5 < _offset || -_offset != lVar5 && _offset <= -lVar5) {
      return -1;
    }
    _offset = _offset + lVar5;
  }
  else {
    if (_whence != 0) {
      return -1;
    }
    if (_offset < 0) {
      return -1;
    }
  }
  if (*(int *)((long)_stream + 0x27c) < 0) {
    op_time_get(&local_48);
  }
  else {
    op_http_conn_read_rate_update((OpusHTTPConn *)((long)_stream + lVar4 * 0x60));
    plVar1 = (long *)((long)_stream + lVar4 * 0x60 + 0x30);
    local_48.tv_sec = *plVar1;
    local_48.tv_nsec = plVar1[1];
  }
  if (lVar6 <= _offset) {
    *(undefined4 *)((long)_stream + 0x27c) = 0xffffffff;
    *(opus_int64 *)((long)_stream + 0x268) = _offset;
    return 0;
  }
  _pnext = (OpusHTTPConn **)((long)_stream + 400);
  pOVar8 = *(OpusHTTPConn **)((long)_stream + 400);
  ppOVar9 = _pnext;
  if (pOVar8 == (OpusHTTPConn *)0x0) {
    local_54 = *(int *)((long)_stream + 0x284);
  }
  else {
    do {
      lVar6 = local_48.tv_sec - (pOVar8->read_time).tv_sec;
      if ((lVar6 < 0x20c49b) &&
         (((lVar6 < -0x20c49a ||
           (auVar2 = SEXT816(local_48.tv_nsec - (pOVar8->read_time).tv_nsec) *
                     SEXT816(0x431bde82d7b634db),
           (int)((ulong)(lVar6 * 0x3e800000000) >> 0x20) +
           ((int)(auVar2._8_8_ >> 0x12) - (auVar2._12_4_ >> 0x1f)) < 0x1389)) &&
          (6 < pOVar8->nrequests_left)))) {
        iVar3 = op_http_conn_estimate_available(pOVar8);
        if (((pOVar8->pos <= _offset) && (_offset - pOVar8->pos <= (long)iVar3)) &&
           (((&pOVar8->end_pos)[(ulong)(-1 < pOVar8->next_pos) * 2] < 0 ||
            (_offset < (&pOVar8->end_pos)[(ulong)(-1 < pOVar8->next_pos) * 2])))) {
          iVar3 = op_http_conn_read_ahead((OpusHTTPStream *)_stream,pOVar8,1,_offset);
          if (iVar3 < 0) goto LAB_0010e693;
          *ppOVar9 = pOVar8->next;
          pOVar8->next = *(OpusHTTPConn **)((long)_stream + 400);
          *(OpusHTTPConn **)((long)_stream + 400) = pOVar8;
          iVar3 = (int)((ulong)((long)pOVar8 - (long)_stream) >> 5);
          goto LAB_0010e864;
        }
        ppOVar9 = &pOVar8->next;
      }
      else {
LAB_0010e693:
        op_http_conn_close((OpusHTTPStream *)_stream,pOVar8,ppOVar9,1);
      }
      pOVar8 = *ppOVar9;
    } while (pOVar8 != (OpusHTTPConn *)0x0);
    pOVar8 = *(OpusHTTPConn **)((long)_stream + 400);
    local_54 = *(int *)((long)_stream + 0x284);
    if (pOVar8 != (OpusHTTPConn *)0x0) {
      _conn = (OpusHTTPConn *)0x0;
      _pnext_00 = (OpusHTTPConn **)0x0;
      ppOVar9 = _pnext;
      do {
        lVar6 = (long)*(int *)((long)_stream + 0x290) * pOVar8->read_rate >> 0xb;
        if (lVar6 < 0x8001) {
          lVar6 = 0x8000;
        }
        local_38 = _conn;
        iVar3 = op_http_conn_estimate_available(pOVar8);
        lVar5 = pOVar8->pos;
        lVar4 = (&pOVar8->end_pos)[(ulong)(-1 < pOVar8->next_pos) * 2];
        if (((_offset < lVar5) || (lVar6 < _offset - (iVar3 + lVar5))) ||
           ((iVar7 = 1, -1 < lVar4 && (lVar4 <= _offset)))) {
          if (((local_54 != 0) && (-1 < lVar4)) && (lVar4 - (lVar5 + iVar3) <= lVar6)) {
            iVar7 = 0;
            goto LAB_0010e811;
          }
          _conn = pOVar8;
          ppOVar10 = &pOVar8->next;
          _pnext_00 = ppOVar9;
        }
        else {
LAB_0010e811:
          iVar3 = op_http_conn_read_ahead((OpusHTTPStream *)_stream,pOVar8,iVar7,_offset);
          if (-1 < iVar3) {
            *ppOVar9 = pOVar8->next;
            pOVar8->next = *(OpusHTTPConn **)((long)_stream + 400);
            *(OpusHTTPConn **)((long)_stream + 400) = pOVar8;
            iVar3 = (int)((ulong)((long)pOVar8 - (long)_stream) >> 5);
LAB_0010e864:
            *(int *)((long)_stream + 0x27c) = iVar3 * -0x55555555;
            return 0;
          }
          op_http_conn_close((OpusHTTPStream *)_stream,pOVar8,ppOVar9,1);
          _conn = local_38;
          ppOVar10 = ppOVar9;
        }
        pOVar8 = *ppOVar10;
        ppOVar9 = ppOVar10;
      } while (pOVar8 != (OpusHTTPConn *)0x0);
      goto LAB_0010e88c;
    }
  }
  _pnext_00 = (OpusHTTPConn **)0x0;
  _conn = (OpusHTTPConn *)0x0;
LAB_0010e88c:
  pOVar8 = *(OpusHTTPConn **)((long)_stream + 0x198);
  if (pOVar8 == (OpusHTTPConn *)0x0) {
    op_http_conn_close((OpusHTTPStream *)_stream,_conn,_pnext_00,1);
    pOVar8 = *(OpusHTTPConn **)((long)_stream + 0x198);
  }
  iVar7 = 0;
  iVar3 = op_http_conn_open_pos
                    ((OpusHTTPStream *)_stream,pOVar8,_offset,-(uint)(local_54 == 0) | 0x8000);
  if (iVar3 < 0) {
    op_http_conn_close((OpusHTTPStream *)_stream,pOVar8,_pnext,1);
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

static int op_http_stream_seek(void *_stream,opus_int64 _offset,int _whence){
  op_time          seek_time;
  OpusHTTPStream  *stream;
  OpusHTTPConn    *conn;
  OpusHTTPConn   **pnext;
  OpusHTTPConn    *close_conn;
  OpusHTTPConn   **close_pnext;
  opus_int64       content_length;
  opus_int64       pos;
  int              pipeline;
  int              ci;
  int              ret;
  stream=(OpusHTTPStream *)_stream;
  if(!stream->seekable)return -1;
  content_length=stream->content_length;
  /*If we're seekable, we should have gotten a Content-Length.*/
  OP_ASSERT(content_length>=0);
  ci=stream->cur_conni;
  pos=ci<0?content_length:stream->conns[ci].pos;
  switch(_whence){
    case SEEK_SET:{
      /*Check for overflow:*/
      if(_offset<0)return -1;
      pos=_offset;
    }break;
    case SEEK_CUR:{
      /*Check for overflow:*/
      if(_offset<-pos||_offset>OP_INT64_MAX-pos)return -1;
      pos+=_offset;
    }break;
    case SEEK_END:{
      /*Check for overflow:*/
      if(_offset<-content_length||_offset>OP_INT64_MAX-content_length){
        return -1;
      }
      pos=content_length+_offset;
    }break;
    default:return -1;
  }
  /*Mark when we deactivated the active connection.*/
  if(ci>=0){
    op_http_conn_read_rate_update(stream->conns+ci);
    *&seek_time=*&stream->conns[ci].read_time;
  }
  else op_time_get(&seek_time);
  /*If we seeked past the end of the stream, just disable the active
     connection.*/
  if(pos>=content_length){
    stream->cur_conni=-1;
    stream->pos=pos;
    return 0;
  }
  /*First try to find a connection we can use without waiting.*/
  pnext=&stream->lru_head;
  conn=stream->lru_head;
  while(conn!=NULL){
    opus_int64 conn_pos;
    opus_int64 end_pos;
    int        available;
    /*If this connection has been dormant too long or has made too many
       requests, close it.
      This is to prevent us from hitting server limits/firewall timeouts.*/
    if(op_time_diff_ms(&seek_time,&conn->read_time)>
     OP_CONNECTION_IDLE_TIMEOUT_MS
     ||conn->nrequests_left<OP_PIPELINE_MIN_REQUESTS){
      op_http_conn_close(stream,conn,pnext,1);
      conn=*pnext;
      continue;
    }
    available=op_http_conn_estimate_available(conn);
    conn_pos=conn->pos;
    end_pos=conn->end_pos;
    if(conn->next_pos>=0){
      OP_ASSERT(end_pos>=0);
      OP_ASSERT(conn->next_pos==end_pos);
      end_pos=conn->next_end;
    }
    OP_ASSERT(end_pos<0||conn_pos<=end_pos);
    /*Can we quickly read ahead without issuing a new request or waiting for
       any more data?
      If we have an oustanding request, we'll over-estimate the amount of data
       it has available (because we'll count the response headers, too), but
       that probably doesn't matter.*/
    if(conn_pos<=pos&&pos-conn_pos<=available&&(end_pos<0||pos<end_pos)){
      /*Found a suitable connection to re-use.*/
      ret=op_http_conn_read_ahead(stream,conn,1,pos);
      if(OP_UNLIKELY(ret<0)){
        /*The connection might have become stale, so close it and keep going.*/
        op_http_conn_close(stream,conn,pnext,1);
        conn=*pnext;
        continue;
      }
      /*Sucessfully resurrected this connection.*/
      *pnext=conn->next;
      conn->next=stream->lru_head;
      stream->lru_head=conn;
      stream->cur_conni=(int)(conn-stream->conns);
      OP_ASSERT(stream->cur_conni>=0&&stream->cur_conni<OP_NCONNS_MAX);
      return 0;
    }
    pnext=&conn->next;
    conn=conn->next;
  }
  /*Chances are that didn't work, so now try to find one we can use by reading
     ahead a reasonable amount and/or by issuing a new request.*/
  close_pnext=NULL;
  close_conn=NULL;
  pnext=&stream->lru_head;
  conn=stream->lru_head;
  pipeline=stream->pipeline;
  while(conn!=NULL){
    opus_int64 conn_pos;
    opus_int64 end_pos;
    opus_int64 read_ahead_thresh;
    int        available;
    int        just_read_ahead;
    /*Dividing by 2048 instead of 1000 scales this by nearly 1/2, biasing away
       from connection re-use (and roughly compensating for the lag required to
       reopen the TCP window of a connection that's been idle).
      There's no overflow checking here, because it's vanishingly unlikely, and
       all it would do is cause us to make poor decisions.*/
    read_ahead_thresh=OP_MAX(OP_READAHEAD_THRESH_MIN,
     stream->connect_rate*conn->read_rate>>11);
    available=op_http_conn_estimate_available(conn);
    conn_pos=conn->pos;
    end_pos=conn->end_pos;
    if(conn->next_pos>=0){
      OP_ASSERT(end_pos>=0);
      OP_ASSERT(conn->next_pos==end_pos);
      end_pos=conn->next_end;
    }
    OP_ASSERT(end_pos<0||conn_pos<=end_pos);
    /*Can we quickly read ahead without issuing a new request?*/
    just_read_ahead=conn_pos<=pos&&pos-conn_pos-available<=read_ahead_thresh
     &&(end_pos<0||pos<end_pos);
    if(just_read_ahead||pipeline&&end_pos>=0
     &&end_pos-conn_pos-available<=read_ahead_thresh){
      /*Found a suitable connection to re-use.*/
      ret=op_http_conn_read_ahead(stream,conn,just_read_ahead,pos);
      if(OP_UNLIKELY(ret<0)){
        /*The connection might have become stale, so close it and keep going.*/
        op_http_conn_close(stream,conn,pnext,1);
        conn=*pnext;
        continue;
      }
      /*Sucessfully resurrected this connection.*/
      *pnext=conn->next;
      conn->next=stream->lru_head;
      stream->lru_head=conn;
      stream->cur_conni=(int)(conn-stream->conns);
      OP_ASSERT(stream->cur_conni>=0&&stream->cur_conni<OP_NCONNS_MAX);
      return 0;
    }
    close_pnext=pnext;
    close_conn=conn;
    pnext=&conn->next;
    conn=conn->next;
  }
  /*No suitable connections.
    Open a new one.*/
  if(stream->free_head==NULL){
    /*All connections in use.
      Expire one of them (we should have already picked which one when scanning
       the list).*/
    OP_ASSERT(close_conn!=NULL);
    OP_ASSERT(close_pnext!=NULL);
    op_http_conn_close(stream,close_conn,close_pnext,1);
  }
  OP_ASSERT(stream->free_head!=NULL);
  conn=stream->free_head;
  /*If we can pipeline, only request a chunk of data.
    If we're seeking now, there's a good chance we will want to seek again
     soon, and this avoids committing this connection to reading the rest of
     the stream.
    Particularly with SSL or proxies, issuing a new request on the same
     connection can be substantially faster than opening a new one.
    This also limits the amount of data the server will blast at us on this
     connection if we later seek elsewhere and start reading from a different
     connection.*/
  ret=op_http_conn_open_pos(stream,conn,pos,
   pipeline?OP_PIPELINE_CHUNK_SIZE:-1);
  if(OP_UNLIKELY(ret<0)){
    op_http_conn_close(stream,conn,&stream->lru_head,1);
    return -1;
  }
  return 0;
}